

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::join(CBString *this,CBStringList *l,CBString *sep)

{
  undefined8 uVar1;
  int iVar2;
  CBStringException *pCVar3;
  size_type sVar4;
  const_reference pvVar5;
  allocator local_129;
  string local_128;
  undefined1 local_108 [8];
  CBStringException bstr__cppwrapper_exception_2;
  string local_d8;
  undefined1 local_b8 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  CBStringException bstr__cppwrapper_exception;
  size_t i;
  int sl;
  int c;
  CBString *sep_local;
  CBStringList *l_local;
  CBString *this_local;
  
  iVar2 = length(sep);
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"CBString::Write protection error",&local_79);
    CBStringException::CBStringException((CBStringException *)local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar3,(CBStringException *)local_58);
    __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  i._4_4_ = 1;
  bstr__cppwrapper_exception.msg.field_2._8_8_ = 0;
  while( true ) {
    uVar1 = bstr__cppwrapper_exception.msg.field_2._8_8_;
    sVar4 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                      ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l);
    if (sVar4 <= (ulong)uVar1) {
      alloc(this,i._4_4_);
      (this->super_tagbstring).slen = 0;
      if ((this->super_tagbstring).data == (uchar *)0x0) {
        (this->super_tagbstring).slen = 0;
        (this->super_tagbstring).mlen = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_128,"CBString::Failure in (CBStringList) constructor",&local_129
                  );
        CBStringException::CBStringException((CBStringException *)local_108,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
        pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
        CBStringException::CBStringException(pCVar3,(CBStringException *)local_108);
        __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
      }
      bstr__cppwrapper_exception.msg.field_2._8_8_ = 0;
      while( true ) {
        uVar1 = bstr__cppwrapper_exception.msg.field_2._8_8_;
        sVar4 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::size
                          ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l);
        if (sVar4 <= (ulong)uVar1) break;
        if (bstr__cppwrapper_exception.msg.field_2._8_8_ != 0) {
          operator+=(this,sep);
        }
        pvVar5 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                           ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                            bstr__cppwrapper_exception.msg.field_2._8_8_);
        operator+=(this,pvVar5);
        bstr__cppwrapper_exception.msg.field_2._8_8_ =
             bstr__cppwrapper_exception.msg.field_2._8_8_ + 1;
      }
      return;
    }
    pvVar5 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::at
                       ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)l,
                        bstr__cppwrapper_exception.msg.field_2._8_8_);
    i._4_4_ = (pvVar5->super_tagbstring).slen + iVar2 + i._4_4_;
    if (i._4_4_ < iVar2) break;
    bstr__cppwrapper_exception.msg.field_2._8_8_ = bstr__cppwrapper_exception.msg.field_2._8_8_ + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"CBString::Failure in (CBStringList) constructor, too long",
             (allocator *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
  CBStringException::CBStringException((CBStringException *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
  pCVar3 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar3,(CBStringException *)local_b8);
  __cxa_throw(pCVar3,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::join (const struct CBStringList& l, const CBString& sep) {
int c, sl = sep.length();
size_t i;

	if (mlen <= 0) {
		bstringThrow ("Write protection error");
	}

	for (c=1, i=0; i < l.size(); i++) {
		c += l.at(i).slen + sl;
		if (c < sl) bstringThrow ("Failure in (CBStringList) constructor, too long");
	}

	alloc (c);
	slen = 0;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in (CBStringList) constructor");
	} else {
		for (i=0; i < l.size(); i++) {
			if (i > 0) *this += sep;
			*this += l.at(i);
		}
	}
}